

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O2

void perform_gamma_composition_tests(png_modifier *pm,int do_background,int expand_16)

{
  png_byte colour_typeIn;
  int iVar1;
  png_uint_32 pVar2;
  png_uint_32 pVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  png_uint_32 pVar8;
  undefined4 in_register_00000034;
  png_modifier *pmIn;
  undefined2 uVar9;
  png_uint_32 pVar10;
  byte bVar11;
  uint uVar12;
  ushort uVar13;
  png_byte bit_depth;
  png_byte colour_type;
  char local_125;
  char local_124;
  byte local_123;
  undefined1 local_122;
  undefined1 uStack_121;
  undefined4 local_120;
  undefined4 local_11c;
  double local_118;
  uint local_110;
  uint palette_number;
  double local_108;
  double local_100;
  uint local_f4;
  undefined8 local_f0;
  ulong local_e8;
  png_modifier *local_e0;
  ulong local_d8;
  char *local_d0;
  ulong local_c8;
  ulong local_c0;
  char name [128];
  
  local_f0 = CONCAT44(in_register_00000034,do_background);
  colour_type = '\0';
  palette_number = 0;
  bit_depth = '\0';
  local_125 = ((uint)pm & 0xfffffffe) == 2 && do_background != 0;
  local_e8 = (ulong)((uint)pm - 1);
  local_e0 = pm;
  do {
    do {
      iVar1 = next_format(&colour_type,&bit_depth,&palette_number,(uint)::pm._1596_4_ >> 0x1e & 1,
                          (uint)::pm._1596_4_ >> 0xc & 1);
      colour_typeIn = bit_depth;
      if (iVar1 == 0) {
        return;
      }
      local_110 = palette_number;
    } while (((colour_type & 4) == 0) && (palette_number == 0 || colour_type == '\x03'));
    local_124 = bit_depth == '\x10' || (int)local_f0 != 0;
    local_f4 = ~(-1 << (bit_depth & 0x1f));
    uVar4 = (ulong)::pm.ngamma_tests;
    local_123 = colour_type;
    uVar6 = 0;
    bVar11 = colour_type;
    while (uVar6 < uVar4) {
      uVar7 = 0;
      local_d8 = uVar6;
      while (uVar4 = (ulong)::pm.ngamma_tests, uVar7 < uVar4) {
        local_108 = 1.0 / ::pm.gammas[local_d8];
        local_118 = ::pm.gammas[uVar7];
        if ((uint)local_e8 < 7) {
          (*(code *)(&DAT_00112300 + *(int *)(&DAT_00112300 + local_e8 * 4)))();
          return;
        }
        local_d0 = "";
        local_100 = 4.0;
        local_c8 = (ulong)(uint)::pm._1596_4_;
        local_c0 = uVar7;
        pVar2 = random_32();
        if (local_124 == '\0') {
          uVar12 = (pVar2 & 0xffff) >> 8;
          local_120 = CONCAT22((short)((pVar2 & 0xffff) >> 8),(short)(pVar2 & 0xff));
          pVar3 = pVar2 >> 0x10 & 0xff;
          local_11c._0_2_ = (undefined2)pVar3;
          pVar10 = pVar2 >> 0x18;
          pVar2 = pVar2 & 0xff;
LAB_0010eee8:
          local_11c = CONCAT22((short)pVar10,(undefined2)local_11c);
        }
        else {
          uVar12 = pVar2 >> 0x10;
          local_120 = pVar2;
          pVar3 = random_32();
          pVar10 = pVar3 >> 0x10;
          local_11c = pVar3;
          if ((local_125 != '\0') && (0.05 < ABS(local_100 * local_118 + -1.0))) {
            uVar13 = (ushort)(pVar2 >> 0x18) * 0x101;
            local_120 = CONCAT22(uVar13,((ushort)pVar2 >> 8) * 0x101);
            pVar8 = ((pVar3 & 0xffff) >> 8) * 0x101;
            local_11c._0_2_ = (undefined2)pVar8;
            pVar10 = (pVar3 >> 0x18) * 0x101;
            uVar12 = (uint)uVar13;
            pVar2 = local_120;
            pVar3 = pVar8;
            goto LAB_0010eee8;
          }
        }
        local_122 = 0xc1;
        if ((bVar11 & 2) == 0) {
          pVar2 = pVar10;
          if (colour_typeIn < 8) {
            pVar2 = pVar10 & local_f4;
            local_11c = pVar2 << 0x10;
          }
          uVar9 = (undefined2)pVar2;
          local_11c = CONCAT22(local_11c._2_2_,uVar9);
          local_120 = CONCAT22(uVar9,uVar9);
          uVar12 = pVar2;
          pVar3 = pVar2;
          pVar10 = pVar2;
        }
        sVar5 = safecat(name,0x80,0,"gamma ");
        sVar5 = safecatd(name,0x80,sVar5,local_108,3);
        sVar5 = safecat(name,0x80,sVar5,"->");
        sVar5 = safecatd(name,0x80,sVar5,local_118,3);
        sVar5 = safecat(name,0x80,sVar5,local_d0);
        bVar11 = local_123;
        if ((int)local_e0 < 4) {
          sVar5 = safecat(name,0x80,sVar5,"(");
          if ((bVar11 & 2) != 0) {
            sVar5 = safecatn(name,0x80,sVar5,pVar2 & 0xffff);
            sVar5 = safecat(name,0x80,sVar5,",");
            sVar5 = safecatn(name,0x80,sVar5,uVar12 & 0xffff);
            sVar5 = safecat(name,0x80,sVar5,",");
            pVar10 = pVar3;
          }
          sVar5 = safecatn(name,0x80,sVar5,pVar10 & 0xffff);
          sVar5 = safecat(name,0x80,sVar5,")^");
          safecatd(name,0x80,sVar5,local_100,3);
        }
        pmIn = (png_modifier *)(ulong)bVar11;
        gamma_test(pmIn,colour_typeIn,(png_byte)local_110,(int)((uint)local_c8 << 0x17) >> 0x17,0,
                   local_108,local_118,'\0',(int)name,(char *)(ulong)((uint)local_c8 >> 0xd & 1),0,
                   (int)local_f0,(int)local_e0,(int)&local_122,
                   (png_color_16 *)
                   CONCAT17(uStack_121,
                            CONCAT16(local_122,
                                     CONCAT15(local_123,
                                              CONCAT14(local_124,
                                                       CONCAT13(local_125,
                                                                CONCAT12(colour_type,
                                                                         CONCAT11(bit_depth,
                                                                                  colour_typeIn)))))
                                    )),local_100);
        iVar1 = fail(pmIn);
        uVar7 = local_c0 + 1;
        if (iVar1 != 0) {
          return;
        }
      }
      uVar6 = local_d8 + 1;
    }
  } while( true );
}

Assistant:

static void
perform_gamma_composition_tests(png_modifier *pm, int do_background,
   int expand_16)
{
   png_byte colour_type = 0;
   png_byte bit_depth = 0;
   unsigned int palette_number = 0;

   /* Skip the non-alpha cases - there is no setting of a transparency colour at
    * present.
    *
    * TODO: incorrect; the palette case sets tRNS and, now RGB and gray do,
    * however the palette case fails miserably so is commented out below.
    */
   while (next_format(&colour_type, &bit_depth, &palette_number,
                      pm->test_lbg_gamma_composition, pm->test_tRNS))
      if ((colour_type & PNG_COLOR_MASK_ALPHA) != 0
#if 0 /* TODO: FIXME */
          /*TODO: FIXME: this should work */
          || colour_type == 3
#endif
          || (colour_type != 3 && palette_number != 0))
   {
      unsigned int i, j;

      /* Don't skip the i==j case here - it's relevant. */
      for (i=0; i<pm->ngamma_tests; ++i)
      {
         for (j=0; j<pm->ngamma_tests; ++j)
         {
            gamma_composition_test(pm, colour_type, bit_depth, palette_number,
               pm->interlace_type, 1/pm->gammas[i], pm->gammas[j],
               pm->use_input_precision, do_background, expand_16);

            if (fail(pm))
               return;
         }
      }
   }
}